

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall UnifiedRegex::CharSet<char16_t>::Sort(CharSet<char16_t> *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint j;
  uint index;
  uint index_00;
  uint index_01;
  
  if (4 < (this->rep).compact.countPlusOne - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x372,"(IsCompact())","IsCompact()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  index_01 = 1;
LAB_00cd8e9b:
  uVar3 = GetCompactLength(this);
  if (uVar3 <= index_01) {
    return;
  }
  uVar3 = GetCompactCharU(this,index_01);
  for (index = 0; index_01 != index; index = index + 1) {
    uVar4 = GetCompactCharU(this,index);
    index_00 = index_01;
    if (uVar3 < uVar4) goto LAB_00cd8ed7;
  }
  goto LAB_00cd8f0f;
LAB_00cd8ed7:
  while ((int)index < (int)index_00) {
    uVar4 = GetCompactCharU(this,index_00 - 1);
    ReplaceCompactCharU(this,index_00,uVar4);
    index_00 = index_00 - 1;
  }
  ReplaceCompactCharU(this,index,uVar3);
LAB_00cd8f0f:
  index_01 = index_01 + 1;
  goto LAB_00cd8e9b;
}

Assistant:

void CharSet<char16>::Sort()
    {
        Assert(IsCompact());
        __assume(this->GetCompactLength() <= MaxCompact);
        for (uint i = 1; i < this->GetCompactLength(); i++)
        {
            uint curr = GetCompactCharU(i);
            for (uint j = 0; j < i; j++)
            {
                if (GetCompactCharU(j) > curr)
                {
                    for (int k = i; k > (int)j; k--)
                    {
                        this->ReplaceCompactCharU(k, this->GetCompactCharU(k - 1));
                    }
                    this->ReplaceCompactCharU(j, curr);
                    break;
                }
            }
        }
    }